

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadedSharingTest::addImageOperations(GLES2ThreadedSharingTest *this)

{
  EGLThread *pEVar1;
  pointer ppEVar2;
  Texture *pTVar3;
  int iVar4;
  InitGLExtension *pIVar5;
  CreateShader *pCVar6;
  ShaderSource *pSVar7;
  ShaderCompile *pSVar8;
  CreateProgram *this_00;
  AttachShader *pAVar9;
  LinkProgram *this_01;
  CreateTexture *pCVar10;
  TexImage2D *pTVar11;
  CreateImageFromTexture *pCVar12;
  DefineTextureFromImage *pDVar13;
  DeleteTexture *pDVar14;
  TexSubImage2D *pTVar15;
  CopyTexSubImage2D *pCVar16;
  CopyTexImage2D *pCVar17;
  RenderTexture *pRVar18;
  ReadPixels *pRVar19;
  CompareData *this_02;
  DestroyImage *pDVar20;
  DeleteShader *pDVar21;
  DeleteProgram *this_03;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *pSVar22;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *pSVar23;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> texture;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> program;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> image;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> sourceTexture;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> fragmentShader;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> vertexShader;
  SharedPtr<tcu::ThreadUtil::DataBlock> pixels2;
  SharedPtr<tcu::ThreadUtil::DataBlock> pixels1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_2a0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_290;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_280;
  SharedPtr<tcu::ThreadUtil::DataBlock> local_270;
  SharedPtr<tcu::ThreadUtil::DataBlock> local_260;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_250;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_240;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_230;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_220;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_210;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_200;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_1f0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_1e0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_1d0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_1c0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_1b0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_1a0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_190;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_180;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_170;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_160;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> local_150;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> local_140;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_130;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_120;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_110;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_100;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_f0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_e0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_d0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_c0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_b0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_a0;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> local_90;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_80;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> local_70;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_60;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_50;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_40;
  
  vertexShader.m_ptr = (Shader *)0x0;
  vertexShader.m_state = (SharedPtrStateBase *)0x0;
  fragmentShader.m_ptr = (Shader *)0x0;
  fragmentShader.m_state = (SharedPtrStateBase *)0x0;
  program.m_ptr = (Program *)0x0;
  program.m_state = (SharedPtrStateBase *)0x0;
  pEVar1 = *(this->m_threads).
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pIVar5 = (InitGLExtension *)operator_new(0x58);
  GLES2ThreadTest::InitGLExtension::InitGLExtension(pIVar5,"GL_OES_EGL_image");
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pIVar5);
  pEVar1 = (this->m_threads).
           super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
           ._M_impl.super__Vector_impl_data._M_start[1];
  pIVar5 = (InitGLExtension *)operator_new(0x58);
  GLES2ThreadTest::InitGLExtension::InitGLExtension(pIVar5,"GL_OES_EGL_image");
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pIVar5);
  if ((this->m_config).render == true) {
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar6 = (CreateShader *)operator_new(0x80);
    GLES2ThreadTest::CreateShader::CreateShader
              (pCVar6,0x8b31,&vertexShader,(this->m_config).useFenceSync,(this->m_config).serverSync
              );
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar6);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar7 = (ShaderSource *)operator_new(0x98);
    local_160.m_ptr = vertexShader.m_ptr;
    local_160.m_state = vertexShader.m_state;
    if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderSource::ShaderSource
              (pSVar7,&local_160,
               "attribute highp vec2 a_pos;\nvarying mediump vec2 v_pos;\nvoid main(void)\n{\n\tv_pos = a_pos;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
               ,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar7);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_160);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar8 = (ShaderCompile *)operator_new(0x78);
    local_170.m_ptr = vertexShader.m_ptr;
    local_170.m_state = vertexShader.m_state;
    if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderCompile::ShaderCompile
              (pSVar8,&local_170,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar8);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_170);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar6 = (CreateShader *)operator_new(0x80);
    GLES2ThreadTest::CreateShader::CreateShader
              (pCVar6,0x8b30,&fragmentShader,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar6);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar7 = (ShaderSource *)operator_new(0x98);
    local_180.m_ptr = fragmentShader.m_ptr;
    local_180.m_state = fragmentShader.m_state;
    if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderSource::ShaderSource
              (pSVar7,&local_180,
               "varying mediump vec2 v_pos;\nuniform sampler2D u_sampler;\nvoid main(void)\n{\n\tgl_FragColor = texture2D(u_sampler, v_pos);\n}\n"
               ,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar7);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_180);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar8 = (ShaderCompile *)operator_new(0x78);
    local_190.m_ptr = fragmentShader.m_ptr;
    local_190.m_state = fragmentShader.m_state;
    if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderCompile::ShaderCompile
              (pSVar8,&local_190,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar8);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_190);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this_00 = (CreateProgram *)operator_new(0x78);
    GLES2ThreadTest::CreateProgram::CreateProgram
              (this_00,&program,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_00);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar9 = (AttachShader *)operator_new(0x88);
    local_1a0.m_ptr = program.m_ptr;
    local_1a0.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_1b0.m_ptr = fragmentShader.m_ptr;
    local_1b0.m_state = fragmentShader.m_state;
    if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::AttachShader::AttachShader
              (pAVar9,&local_1a0,&local_1b0,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pAVar9);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_1b0);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&local_1a0);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar9 = (AttachShader *)operator_new(0x88);
    local_1c0.m_ptr = program.m_ptr;
    local_1c0.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_1d0.m_ptr = vertexShader.m_ptr;
    local_1d0.m_state = vertexShader.m_state;
    if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::AttachShader::AttachShader
              (pAVar9,&local_1c0,&local_1d0,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pAVar9);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_1d0);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&local_1c0);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this_01 = (LinkProgram *)operator_new(0x78);
    local_1e0.m_ptr = program.m_ptr;
    local_1e0.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::LinkProgram::LinkProgram
              (this_01,&local_1e0,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_01);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&local_1e0);
  }
  sourceTexture.m_ptr = (Texture *)0x0;
  sourceTexture.m_state = (SharedPtrStateBase *)0x0;
  texture.m_ptr = (Texture *)0x0;
  texture.m_state = (SharedPtrStateBase *)0x0;
  image.m_ptr = (EGLImage *)0x0;
  image.m_state = (SharedPtrStateBase *)0x0;
  pEVar1 = *(this->m_threads).
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar10 = (CreateTexture *)operator_new(0x78);
  GLES2ThreadTest::CreateTexture::CreateTexture
            (pCVar10,&sourceTexture,(this->m_config).useFenceSync,(this->m_config).serverSync);
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar10);
  pEVar1 = *(this->m_threads).
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pTVar11 = (TexImage2D *)operator_new(0x90);
  local_1f0.m_ptr = sourceTexture.m_ptr;
  local_1f0.m_state = sourceTexture.m_state;
  if (sourceTexture.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (sourceTexture.m_state)->strongRefCount = (sourceTexture.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (sourceTexture.m_state)->weakRefCount = (sourceTexture.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  GLES2ThreadTest::TexImage2D::TexImage2D
            (pTVar11,&local_1f0,0,0x1908,0x100,0x100,0x1908,0x1401,(this->m_config).useFenceSync,
             (this->m_config).serverSync);
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pTVar11);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::release(&local_1f0);
  iVar4 = (this->m_config).define;
  if (iVar4 == 1) {
    if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
      pEVar1 = (this->m_threads).
               super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1];
      pCVar12 = (CreateImageFromTexture *)operator_new(0x88);
      local_50.m_ptr = sourceTexture.m_ptr;
      local_50.m_state = sourceTexture.m_state;
      if (sourceTexture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (sourceTexture.m_state)->strongRefCount = (sourceTexture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (sourceTexture.m_state)->weakRefCount = (sourceTexture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar23 = &local_50;
      GLES2ThreadTest::CreateImageFromTexture::CreateImageFromTexture
                (pCVar12,&image,pSVar23,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar12);
    }
    else {
      pEVar1 = *(this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar12 = (CreateImageFromTexture *)operator_new(0x88);
      local_40.m_ptr = sourceTexture.m_ptr;
      local_40.m_state = sourceTexture.m_state;
      if (sourceTexture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (sourceTexture.m_state)->strongRefCount = (sourceTexture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (sourceTexture.m_state)->weakRefCount = (sourceTexture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar23 = &local_40;
      GLES2ThreadTest::CreateImageFromTexture::CreateImageFromTexture
                (pCVar12,&image,pSVar23,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar12);
    }
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::release(pSVar23);
    iVar4 = (this->m_config).define;
  }
  if (iVar4 == 2) {
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar12 = (CreateImageFromTexture *)operator_new(0x88);
    local_200.m_ptr = sourceTexture.m_ptr;
    local_200.m_state = sourceTexture.m_state;
    if (sourceTexture.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (sourceTexture.m_state)->strongRefCount = (sourceTexture.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (sourceTexture.m_state)->weakRefCount = (sourceTexture.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::CreateImageFromTexture::CreateImageFromTexture
              (pCVar12,&image,&local_200,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar12);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::release(&local_200);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar10 = (CreateTexture *)operator_new(0x78);
    GLES2ThreadTest::CreateTexture::CreateTexture
              (pCVar10,&texture,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar10);
    if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
      pEVar1 = (this->m_threads).
               super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1];
      pDVar13 = (DefineTextureFromImage *)operator_new(0x88);
      local_80.m_ptr = texture.m_ptr;
      local_80.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      local_90.m_ptr = image.m_ptr;
      local_90.m_state = image.m_state;
      if (image.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (image.m_state)->strongRefCount = (image.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (image.m_state)->weakRefCount = (image.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar23 = &local_80;
      pSVar22 = &local_90;
      GLES2ThreadTest::DefineTextureFromImage::DefineTextureFromImage
                (pDVar13,pSVar23,pSVar22,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar13);
    }
    else {
      pEVar1 = *(this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pDVar13 = (DefineTextureFromImage *)operator_new(0x88);
      local_60.m_ptr = texture.m_ptr;
      local_60.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      local_70.m_ptr = image.m_ptr;
      local_70.m_state = image.m_state;
      if (image.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (image.m_state)->strongRefCount = (image.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (image.m_state)->weakRefCount = (image.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar23 = &local_60;
      pSVar22 = &local_70;
      GLES2ThreadTest::DefineTextureFromImage::DefineTextureFromImage
                (pDVar13,pSVar23,pSVar22,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar13);
    }
    de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::release(pSVar22);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::release(pSVar23);
  }
  pEVar1 = *(this->m_threads).
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pDVar14 = (DeleteTexture *)operator_new(0x78);
  local_210.m_ptr = sourceTexture.m_ptr;
  local_210.m_state = sourceTexture.m_state;
  if (sourceTexture.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (sourceTexture.m_state)->strongRefCount = (sourceTexture.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (sourceTexture.m_state)->weakRefCount = (sourceTexture.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  GLES2ThreadTest::DeleteTexture::DeleteTexture
            (pDVar14,&local_210,(this->m_config).useFenceSync,(this->m_config).serverSync);
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar14);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::release(&local_210);
  iVar4 = (this->m_config).modify;
  if (iVar4 == 1) {
    ppEVar2 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_config).render == true) {
      pEVar1 = *ppEVar2;
      pTVar15 = (TexSubImage2D *)operator_new(0x98);
      local_a0.m_ptr = texture.m_ptr;
      local_a0.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar23 = &local_a0;
      GLES2ThreadTest::TexSubImage2D::TexSubImage2D
                (pTVar15,pSVar23,0,0x11,0x11,0x1d,0x1d,0x1908,0x1401,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pTVar15);
    }
    else {
      pEVar1 = ppEVar2[1];
      pTVar15 = (TexSubImage2D *)operator_new(0x98);
      local_b0.m_ptr = texture.m_ptr;
      local_b0.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar23 = &local_b0;
      GLES2ThreadTest::TexSubImage2D::TexSubImage2D
                (pTVar15,pSVar23,0,0x11,0x11,0x1d,0x1d,0x1908,0x1401,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pTVar15);
    }
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::release(pSVar23);
    iVar4 = (this->m_config).modify;
  }
  if (iVar4 == 2) {
    ppEVar2 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_config).render == true) {
      pEVar1 = *ppEVar2;
      pCVar16 = (CopyTexSubImage2D *)operator_new(0x98);
      local_c0.m_ptr = texture.m_ptr;
      local_c0.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar23 = &local_c0;
      GLES2ThreadTest::CopyTexSubImage2D::CopyTexSubImage2D
                (pCVar16,pSVar23,0,7,7,0x11,0x11,0x1d,0x1d,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar16);
    }
    else {
      pEVar1 = ppEVar2[1];
      pCVar16 = (CopyTexSubImage2D *)operator_new(0x98);
      local_d0.m_ptr = texture.m_ptr;
      local_d0.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar23 = &local_d0;
      GLES2ThreadTest::CopyTexSubImage2D::CopyTexSubImage2D
                (pCVar16,pSVar23,0,7,7,0x11,0x11,0x1d,0x1d,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar16);
    }
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::release(pSVar23);
  }
  iVar4 = (this->m_config).modify;
  if (iVar4 == 3) {
    ppEVar2 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_config).render == true) {
      pEVar1 = *ppEVar2;
      pTVar11 = (TexImage2D *)operator_new(0x90);
      local_e0.m_ptr = texture.m_ptr;
      local_e0.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar23 = &local_e0;
      GLES2ThreadTest::TexImage2D::TexImage2D
                (pTVar11,pSVar23,0,0x1908,0x100,0x100,0x1908,0x1401,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pTVar11);
    }
    else {
      pEVar1 = ppEVar2[1];
      pTVar11 = (TexImage2D *)operator_new(0x90);
      local_f0.m_ptr = texture.m_ptr;
      local_f0.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar23 = &local_f0;
      GLES2ThreadTest::TexImage2D::TexImage2D
                (pTVar11,pSVar23,0,0x1908,0x100,0x100,0x1908,0x1401,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pTVar11);
    }
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::release(pSVar23);
    iVar4 = (this->m_config).modify;
  }
  if (iVar4 == 4) {
    ppEVar2 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_config).render == true) {
      pEVar1 = *ppEVar2;
      pCVar17 = (CopyTexImage2D *)operator_new(0x98);
      local_100.m_ptr = texture.m_ptr;
      local_100.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar23 = &local_100;
      GLES2ThreadTest::CopyTexImage2D::CopyTexImage2D
                (pCVar17,pSVar23,0,0x1908,7,7,0x100,0x100,0,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar17);
    }
    else {
      pEVar1 = ppEVar2[1];
      pCVar17 = (CopyTexImage2D *)operator_new(0x98);
      local_110.m_ptr = texture.m_ptr;
      local_110.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar23 = &local_110;
      GLES2ThreadTest::CopyTexImage2D::CopyTexImage2D
                (pCVar17,pSVar23,0,0x1908,7,7,0x100,0x100,0,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar17);
    }
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::release(pSVar23);
  }
  if ((this->m_config).render == true) {
    pixels1.m_ptr = (DataBlock *)0x0;
    pixels1.m_state = (SharedPtrStateBase *)0x0;
    pixels2.m_ptr = (DataBlock *)0x0;
    pixels2.m_state = (SharedPtrStateBase *)0x0;
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar18 = (RenderTexture *)operator_new(0x88);
    local_220.m_ptr = program.m_ptr;
    local_220.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_230.m_ptr = texture.m_ptr;
    local_230.m_state = texture.m_state;
    if (texture.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::RenderTexture::RenderTexture
              (pRVar18,&local_220,&local_230,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pRVar18);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::release(&local_230);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&local_220);
    pEVar1 = (this->m_threads).
             super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
             ._M_impl.super__Vector_impl_data._M_start[1];
    pRVar18 = (RenderTexture *)operator_new(0x88);
    local_240.m_ptr = program.m_ptr;
    local_240.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_250.m_ptr = texture.m_ptr;
    local_250.m_state = texture.m_state;
    if (texture.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::RenderTexture::RenderTexture
              (pRVar18,&local_240,&local_250,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pRVar18);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::release(&local_250);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&local_240);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar19 = (ReadPixels *)operator_new(0x90);
    GLES2ThreadTest::ReadPixels::ReadPixels
              (pRVar19,0,0,400,400,0x1908,0x1401,&pixels1,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pRVar19);
    pEVar1 = (this->m_threads).
             super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
             ._M_impl.super__Vector_impl_data._M_start[1];
    pRVar19 = (ReadPixels *)operator_new(0x90);
    GLES2ThreadTest::ReadPixels::ReadPixels
              (pRVar19,0,0,400,400,0x1908,0x1401,&pixels2,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pRVar19);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this_02 = (CompareData *)operator_new(0x58);
    local_260.m_ptr = pixels1.m_ptr;
    local_260.m_state = pixels1.m_state;
    if (pixels1.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (pixels1.m_state)->strongRefCount = (pixels1.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (pixels1.m_state)->weakRefCount = (pixels1.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_270.m_ptr = pixels2.m_ptr;
    local_270.m_state = pixels2.m_state;
    if (pixels2.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (pixels2.m_state)->strongRefCount = (pixels2.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (pixels2.m_state)->weakRefCount = (pixels2.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    tcu::ThreadUtil::CompareData::CompareData(this_02,&local_260,&local_270);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_02);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::release(&local_270);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::release(&local_260);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::release(&pixels2);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::release(&pixels1);
  }
  pTVar3 = texture.m_ptr;
  if (texture.m_ptr != (Texture *)0x0) {
    if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
      pEVar1 = (this->m_threads).
               super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1];
      pDVar14 = (DeleteTexture *)operator_new(0x78);
      local_130.m_ptr = pTVar3;
      local_130.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar23 = &local_130;
      GLES2ThreadTest::DeleteTexture::DeleteTexture
                (pDVar14,pSVar23,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar14);
    }
    else {
      pEVar1 = *(this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pDVar14 = (DeleteTexture *)operator_new(0x78);
      local_120.m_ptr = pTVar3;
      local_120.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar23 = &local_120;
      GLES2ThreadTest::DeleteTexture::DeleteTexture
                (pDVar14,pSVar23,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar14);
    }
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::release(pSVar23);
  }
  if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
    pEVar1 = (this->m_threads).
             super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
             ._M_impl.super__Vector_impl_data._M_start[1];
    pDVar20 = (DestroyImage *)operator_new(0x78);
    local_150.m_ptr = image.m_ptr;
    local_150.m_state = image.m_state;
    if (image.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (image.m_state)->strongRefCount = (image.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (image.m_state)->weakRefCount = (image.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    pSVar22 = &local_150;
    GLES2ThreadTest::DestroyImage::DestroyImage
              (pDVar20,pSVar22,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar20);
  }
  else {
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar20 = (DestroyImage *)operator_new(0x78);
    local_140.m_ptr = image.m_ptr;
    local_140.m_state = image.m_state;
    if (image.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (image.m_state)->strongRefCount = (image.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (image.m_state)->weakRefCount = (image.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    pSVar22 = &local_140;
    GLES2ThreadTest::DestroyImage::DestroyImage
              (pDVar20,pSVar22,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar20);
  }
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::release(pSVar22);
  if ((this->m_config).render == true) {
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar21 = (DeleteShader *)operator_new(0x78);
    local_280.m_ptr = vertexShader.m_ptr;
    local_280.m_state = vertexShader.m_state;
    if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar21,&local_280,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar21);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_280);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar21 = (DeleteShader *)operator_new(0x78);
    local_290.m_ptr = fragmentShader.m_ptr;
    local_290.m_state = fragmentShader.m_state;
    if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar21,&local_290,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar21);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_290);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this_03 = (DeleteProgram *)operator_new(0x78);
    local_2a0.m_ptr = program.m_ptr;
    local_2a0.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteProgram::DeleteProgram
              (this_03,&local_2a0,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_03);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&local_2a0);
  }
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::release(&image);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::release(&texture);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::release(&sourceTexture);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&program);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&fragmentShader);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&vertexShader);
  return;
}

Assistant:

void GLES2ThreadedSharingTest::addImageOperations (void)
{
	// Add operations for verify
	SharedPtr<GLES2ThreadTest::Shader>	vertexShader;
	SharedPtr<GLES2ThreadTest::Shader>	fragmentShader;
	SharedPtr<GLES2ThreadTest::Program>	program;

	m_threads[0]->addOperation(new GLES2ThreadTest::InitGLExtension("GL_OES_EGL_image"));
	m_threads[1]->addOperation(new GLES2ThreadTest::InitGLExtension("GL_OES_EGL_image"));

	if (m_config.render)
	{
		const char* vertexShaderSource =
		"attribute highp vec2 a_pos;\n"
		"varying mediump vec2 v_pos;\n"
		"void main(void)\n"
		"{\n"
		"\tv_pos = a_pos;\n"
		"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
		"}\n";

		const char* fragmentShaderSource =
		"varying mediump vec2 v_pos;\n"
		"uniform sampler2D u_sampler;\n"
		"void main(void)\n"
		"{\n"
		"\tgl_FragColor = texture2D(u_sampler, v_pos);\n"
		"}\n";

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(GL_VERTEX_SHADER, vertexShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(vertexShader, vertexShaderSource, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(vertexShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(GL_FRAGMENT_SHADER, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(fragmentShader, fragmentShaderSource, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(fragmentShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateProgram(program, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::AttachShader(program, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::AttachShader(program, vertexShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::LinkProgram(program, m_config.useFenceSync, m_config.serverSync));
	}

	SharedPtr<GLES2ThreadTest::Texture>		sourceTexture;
	SharedPtr<GLES2ThreadTest::Texture>		texture;
	SharedPtr<GLES2ThreadTest::EGLImage>	image;

	m_threads[0]->addOperation(new GLES2ThreadTest::CreateTexture(sourceTexture, m_config.useFenceSync, m_config.serverSync));
	m_threads[0]->addOperation(new GLES2ThreadTest::TexImage2D(sourceTexture, 0, GL_RGBA, 256, 256, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));

	if (m_config.define == 1)
	{
		if (m_config.modify || m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::CreateImageFromTexture(image, sourceTexture, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::CreateImageFromTexture(image, sourceTexture, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.define == 2)
	{
		m_threads[0]->addOperation(new GLES2ThreadTest::CreateImageFromTexture(image, sourceTexture, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::CreateTexture(texture, m_config.useFenceSync, m_config.serverSync));

		if (m_config.modify || m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::DefineTextureFromImage(texture, image, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::DefineTextureFromImage(texture, image, m_config.useFenceSync, m_config.serverSync));
	}

	m_threads[0]->addOperation(new GLES2ThreadTest::DeleteTexture(sourceTexture, m_config.useFenceSync, m_config.serverSync));

	if (m_config.modify == 1)
	{
		DE_ASSERT(m_config.define != 1);

		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::TexSubImage2D(texture, 0, 17, 17, 29, 29, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::TexSubImage2D(texture, 0, 17, 17, 29, 29, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify == 2)
	{
		DE_ASSERT(m_config.define != 1);

		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::CopyTexSubImage2D(texture, 0, 7, 7, 17, 17, 29, 29, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::CopyTexSubImage2D(texture, 0, 7, 7, 17, 17, 29, 29, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify == 3)
	{
		DE_ASSERT(m_config.define != 1);

		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::TexImage2D(texture, 0, GL_RGBA, 256, 256, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::TexImage2D(texture, 0, GL_RGBA, 256, 256, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify == 4)
	{
		DE_ASSERT(m_config.define != 1);

		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::CopyTexImage2D(texture, 0, GL_RGBA, 7, 7, 256, 256, 0, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::CopyTexImage2D(texture, 0, GL_RGBA, 7, 7, 256, 256, 0, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.render)
	{
		DE_ASSERT(m_config.define != 1);

		SharedPtr<tcu::ThreadUtil::DataBlock> pixels1;
		SharedPtr<tcu::ThreadUtil::DataBlock> pixels2;

		m_threads[0]->addOperation(new GLES2ThreadTest::RenderTexture(program, texture, m_config.useFenceSync, m_config.serverSync));
		m_threads[1]->addOperation(new GLES2ThreadTest::RenderTexture(program, texture, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::ReadPixels(0, 0, 400, 400, GL_RGBA, GL_UNSIGNED_BYTE, pixels1, m_config.useFenceSync, m_config.serverSync));
		m_threads[1]->addOperation(new GLES2ThreadTest::ReadPixels(0, 0, 400, 400, GL_RGBA, GL_UNSIGNED_BYTE, pixels2, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new tcu::ThreadUtil::CompareData(pixels1, pixels2));
	}

	if (texture)
	{
		if (m_config.modify || m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::DeleteTexture(texture, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::DeleteTexture(texture, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify || m_config.render)
		m_threads[0]->addOperation(new GLES2ThreadTest::DestroyImage(image, m_config.useFenceSync, m_config.serverSync));
	else
		m_threads[1]->addOperation(new GLES2ThreadTest::DestroyImage(image, m_config.useFenceSync, m_config.serverSync));

	if (m_config.render)
	{
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(vertexShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteProgram(program, m_config.useFenceSync, m_config.serverSync));
	}
}